

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool libcellml::updateUnitMultiplier(UnitsPtr *units,int direction,double *multiplier)

{
  EntityImpl *pEVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  element_type *this;
  size_t index;
  bool ok;
  double localMultiplier;
  UnitsPtr refUnits;
  ModelPtr model;
  string ref;
  UnitsPtr importedUnits;
  ImportSourcePtr importSource;
  double branchMult;
  double exp;
  double expMult;
  bool local_f5;
  int local_f4;
  double local_f0;
  double local_e8;
  undefined1 local_e0 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  string local_c0;
  double *local_a0;
  string local_98;
  string local_78;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_f0 = 0.0;
  local_f4 = direction;
  local_a0 = multiplier;
  bVar2 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (bVar2) {
    bVar2 = ImportedEntity::isResolved(&this->super_ImportedEntity);
    if (bVar2) {
      ImportedEntity::importSource
                (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      ImportSource::model((ImportSource *)(local_e0 + 0x10));
      ImportedEntity::importReference_abi_cxx11_
                (&local_c0,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      Model::units((Model *)&local_98,(string *)local_e0._16_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
      }
      updateUnitMultiplier((UnitsPtr *)&local_98,1,&local_f0);
      *local_a0 = (double)local_f4 * local_f0 + *local_a0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
      bVar2 = true;
    }
    else {
LAB_002544ac:
      bVar2 = false;
    }
  }
  else {
    pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    bVar2 = true;
    if (*(size_type *)((long)&pEVar1[2].mId.field_2 + 8) !=
        pEVar1[2].mId.field_2._M_allocated_capacity) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
      if (*(size_type *)((long)&pEVar1[2].mId.field_2 + 8) ==
          pEVar1[2].mId.field_2._M_allocated_capacity) {
        *local_a0 = (double)local_f4 * 0.0 + *local_a0;
      }
      else {
        local_e8 = 0.0;
        index = 0;
        do {
          Units::unitAttributes(this,index,&local_c0,&local_78,&local_40,&local_38,&local_98);
          local_50 = log10(local_38);
          iVar3 = convertPrefixToInt(&local_78,&local_f5);
          if (local_f5 == false) {
LAB_00254449:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,
                              CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                       local_98.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,
                              CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                       local_78.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,
                              CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                       local_c0.field_2._M_local_buf[0]) + 1);
            }
            goto LAB_002544ac;
          }
          bVar2 = isStandardUnitName(&local_c0);
          local_58 = (double)iVar3;
          if (!bVar2) {
            local_e0._0_8_ =
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_e0._8_8_ =
                 (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count
                     + 1;
              }
            }
            owningModel((ParentedEntityConstPtr *)(local_e0 + 0x10));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
            }
            Model::units((Model *)local_e0,(string *)local_e0._16_8_);
            if ((element_type *)local_e0._0_8_ != (element_type *)0x0) {
              local_48 = 0.0;
              bVar2 = updateUnitMultiplier((UnitsPtr *)local_e0,1,&local_48);
              if (bVar2) {
                local_f0 = local_48 * local_40 + local_50 + local_58 + local_f0;
                local_e8 = local_f0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
                }
                if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
                }
                goto LAB_00254353;
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
            }
            if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
            }
            goto LAB_00254449;
          }
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                         *)standardMultiplierList_abi_cxx11_,&local_c0);
          local_f0 = local_e8 + *pmVar4 * local_40 + local_50 + local_58;
          local_e8 = local_f0;
LAB_00254353:
          this = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          pEVar1 = (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
          index = index + 1;
        } while (index < (ulong)(((long)(*(long *)((long)&pEVar1[2].mId.field_2 + 8) -
                                        pEVar1[2].mId.field_2._M_allocated_capacity) >> 4) *
                                0x6db6db6db6db6db7));
        *local_a0 = local_e8 * (double)local_f4 + *local_a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
      }
      bVar2 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  return bVar2;
}

Assistant:

bool updateUnitMultiplier(const UnitsPtr &units, int direction, double &multiplier)
{
    double localMultiplier = 0;

    if (units->isImport()) {
        if (units->isResolved()) {
            auto importSource = units->importSource();
            auto importedUnits = importSource->model()->units(units->importReference());
            updateUnitMultiplier(importedUnits, 1, localMultiplier);
            multiplier += localMultiplier * direction;
        } else {
            return false;
        }
    } else if (units->unitCount() > 0) {
        std::string ref;
        std::string pre;
        std::string id;
        double exp;
        double mult;
        double expMult;
        double standardMult = 0.0;
        double prefixMult = 0.0;
        for (size_t i = 0; i < units->unitCount(); ++i) {
            units->unitAttributes(i, ref, pre, exp, expMult, id);
            mult = std::log10(expMult);

            bool ok;
            prefixMult = convertPrefixToInt(pre, &ok);
            if (!ok) {
                return false;
            }

            if (isStandardUnitName(ref)) {
                standardMult = standardMultiplierList.at(ref);
                // Combine the information into a single local multiplier: exponent only applies to standard multiplier.
                localMultiplier += mult + standardMult * exp + prefixMult;
            } else {
                auto model = owningModel(units);
                auto refUnits = model->units(ref);
                if (refUnits == nullptr) {
                    return false;
                }
                double branchMult = 0.0;
                // Return false when we can't find a valid prefix.
                if (!updateUnitMultiplier(refUnits, 1, branchMult)) {
                    return false;
                }
                // Make the direction positive on all branches, direction is only applied at the end.
                localMultiplier += mult + branchMult * exp + prefixMult;
            }
        }
        multiplier += localMultiplier * direction;
    }

    return true;
}